

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseExpressionWithPrecedenceUnary(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *this_00;
  ParseOptions *this_01;
  LanguageExtensions *this_02;
  allocator<char> local_c1;
  string local_c0;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  code *local_80;
  undefined8 local_78;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  undefined8 local_58;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  code *local_30;
  undefined8 local_28;
  ExpressionSyntax **local_20;
  ExpressionSyntax **expr_local;
  Parser *this_local;
  
  local_20 = expr;
  expr_local = (ExpressionSyntax **)this;
  this_00 = peek(this,1);
  SVar2 = SyntaxToken::kind(this_00);
  switch(SVar2) {
  case PlusPlusToken:
    local_30 = parseExpressionWithPrecedenceUnary;
    local_28 = 0;
    this_local._7_1_ =
         parsePrefixUnaryExpression_AtFirst(this,local_20,PreIncrementExpression,0x418e00);
    break;
  case MinusMinusToken:
    local_40 = parseExpressionWithPrecedenceUnary;
    local_38 = 0;
    this_local._7_1_ =
         parsePrefixUnaryExpression_AtFirst(this,local_20,PreDecrementExpression,0x418e00);
    break;
  case AsteriskToken:
    local_60 = parseExpressionWithPrecedenceCast;
    local_58 = 0;
    this_local._7_1_ =
         parsePrefixUnaryExpression_AtFirst(this,local_20,PointerIndirectionExpression,0x419430);
    break;
  case AmpersandToken:
    local_50 = parseExpressionWithPrecedenceCast;
    local_48 = 0;
    this_local._7_1_ =
         parsePrefixUnaryExpression_AtFirst(this,local_20,AddressOfExpression,0x419430);
    break;
  case PlusToken:
    local_70 = parseExpressionWithPrecedenceCast;
    local_68 = 0;
    this_local._7_1_ =
         parsePrefixUnaryExpression_AtFirst(this,local_20,UnaryPlusExpression,0x419430);
    break;
  case MinusToken:
    local_80 = parseExpressionWithPrecedenceCast;
    local_78 = 0;
    this_local._7_1_ =
         parsePrefixUnaryExpression_AtFirst(this,local_20,UnaryMinusExpression,0x419430);
    break;
  case OperatorName_COMPLToken:
    local_90 = parseExpressionWithPrecedenceCast;
    local_88 = 0;
    this_local._7_1_ =
         parsePrefixUnaryExpression_AtFirst(this,local_20,BitwiseNotExpression,0x419430);
    break;
  default:
    this_local._7_1_ = parseExpressionWithPrecedencePostfix(this,local_20);
    break;
  case ExclamationToken:
    local_a0 = parseExpressionWithPrecedenceCast;
    local_98 = 0;
    this_local._7_1_ =
         parsePrefixUnaryExpression_AtFirst(this,local_20,LogicalNotExpression,0x419430);
    break;
  case AmpersandAmpersandToken:
    this_01 = SyntaxTree::parseOptions(this->tree_);
    this_02 = ParseOptions::languageExtensions(this_01);
    bVar1 = LanguageExtensions::isEnabled_extGNU_LabelsAsValues(this_02);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"GNU labels as values",&local_c1);
      DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
    }
    this_local._7_1_ =
         parsePrefixUnaryExpression_AtFirst(this,local_20,ExtGNU_LabelAddress,0x419430);
    break;
  case Keyword_sizeof:
    this_local._7_1_ = parseTypeTraitExpression_AtFirst(this,local_20,SizeofExpression);
    break;
  case KeywordAlias___alignof:
    this_local._7_1_ = parseTypeTraitExpression_AtFirst(this,local_20,AlignofExpression);
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseExpressionWithPrecedenceUnary(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();

    switch (peek().kind()) {
        /* 6.5.3.1 */
        case SyntaxKind::PlusPlusToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::PreIncrementExpression,
                        &Parser::parseExpressionWithPrecedenceUnary);

        case SyntaxKind::MinusMinusToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::PreDecrementExpression,
                        &Parser::parseExpressionWithPrecedenceUnary);

        /* 6.5.3.2 */
        case SyntaxKind::AmpersandToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::AddressOfExpression,
                        &Parser::parseExpressionWithPrecedenceCast);

        case SyntaxKind::AsteriskToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::PointerIndirectionExpression,
                        &Parser::parseExpressionWithPrecedenceCast);

        /* 6.5.3.3 */
        case SyntaxKind::PlusToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::UnaryPlusExpression,
                        &Parser::parseExpressionWithPrecedenceCast);

        case SyntaxKind::MinusToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::UnaryMinusExpression,
                        &Parser::parseExpressionWithPrecedenceCast);

        case SyntaxKind::TildeToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::BitwiseNotExpression,
                        &Parser::parseExpressionWithPrecedenceCast);

        case SyntaxKind::ExclamationToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::LogicalNotExpression,
                        &Parser::parseExpressionWithPrecedenceCast);

        /* 6.5.3.4 */
        case SyntaxKind::Keyword_sizeof:
            return parseTypeTraitExpression_AtFirst(expr, SyntaxKind::SizeofExpression);

        case SyntaxKind::Keyword__Alignof:
            return parseTypeTraitExpression_AtFirst(expr, SyntaxKind::AlignofExpression);

        /* GNU labels as values */
        case SyntaxKind::AmpersandAmpersandToken:
            if (!tree_->parseOptions().languageExtensions().isEnabled_extGNU_LabelsAsValues())
                diagReporter_.ExpectedFeature("GNU labels as values");
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::ExtGNU_LabelAddress,
                        &Parser::parseExpressionWithPrecedenceCast);

        default:
            return parseExpressionWithPrecedencePostfix(expr);
    }
}